

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_splitter.cpp
# Opt level: O2

void __thiscall MeshSplitter::Execute(MeshSplitter *this,aiScene *pScene)

{
  aiMesh **__s;
  long lVar1;
  uint a;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  source_mesh_map;
  _Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar2 = 0; uVar2 < pScene->mNumMeshes; uVar2 = uVar2 + 1) {
    SplitMesh(this,(uint)uVar2,pScene->mMeshes[uVar2],
              (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
               *)&local_48);
  }
  uVar2 = (long)local_48._M_impl.super__Vector_impl_data._M_finish -
          (long)local_48._M_impl.super__Vector_impl_data._M_start;
  uVar4 = uVar2 >> 4;
  uVar3 = (uint)uVar4;
  if (pScene->mNumMeshes != uVar3) {
    if (pScene->mMeshes != (aiMesh **)0x0) {
      operator_delete__(pScene->mMeshes);
    }
    pScene->mNumMeshes = uVar3;
    uVar2 = uVar2 >> 1 & 0x7fffffff8;
    __s = (aiMesh **)operator_new__(uVar2);
    memset(__s,0,uVar2);
    pScene->mMeshes = __s;
    for (lVar1 = 0; (uVar4 & 0xffffffff) << 3 != lVar1; lVar1 = lVar1 + 8) {
      *(undefined8 *)((long)pScene->mMeshes + lVar1) =
           *(undefined8 *)
            ((long)&(local_48._M_impl.super__Vector_impl_data._M_start)->first + lVar1 * 2);
    }
    UpdateNode(this,pScene->mRootNode,
               (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                *)&local_48);
  }
  std::
  _Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  ::~_Vector_base(&local_48);
  return;
}

Assistant:

void MeshSplitter::Execute( aiScene* pScene) {
	std::vector<std::pair<aiMesh*, unsigned int> > source_mesh_map;

	for( unsigned int a = 0; a < pScene->mNumMeshes; a++) {
		SplitMesh(a, pScene->mMeshes[a],source_mesh_map);
	}

	const unsigned int size = static_cast<unsigned int>(source_mesh_map.size());
	if (size != pScene->mNumMeshes) {
		// it seems something has been split. rebuild the mesh list
		delete[] pScene->mMeshes;
		pScene->mNumMeshes = size;
		pScene->mMeshes = new aiMesh*[size]();

		for (unsigned int i = 0; i < size;++i) {
			pScene->mMeshes[i] = source_mesh_map[i].first;
		}

		// now we need to update all nodes
		UpdateNode(pScene->mRootNode,source_mesh_map);
	}
}